

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

int coda_product_definition_add_detection_rule
              (coda_product_definition *product_definition,coda_detection_rule *detection_rule)

{
  int iVar1;
  coda_detection_rule **ppcVar2;
  coda_detection_rule **new_detection_rule;
  coda_detection_rule *detection_rule_local;
  coda_product_definition *product_definition_local;
  
  if (detection_rule->num_entries == 0) {
    coda_set_error(-400,"detection rule for \'%s\' should have at least one entry",
                   product_definition->name);
    product_definition_local._4_4_ = -1;
  }
  else {
    detection_rule->product_definition = product_definition;
    iVar1 = data_dictionary_add_detection_rule(detection_rule);
    if (iVar1 == 0) {
      ppcVar2 = (coda_detection_rule **)
                realloc(product_definition->detection_rule,
                        (long)(product_definition->num_detection_rules + 1) << 3);
      if (ppcVar2 == (coda_detection_rule **)0x0) {
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)(product_definition->num_detection_rules + 1) << 3,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                       ,0x186);
        product_definition_local._4_4_ = -1;
      }
      else {
        product_definition->detection_rule = ppcVar2;
        product_definition->num_detection_rules = product_definition->num_detection_rules + 1;
        product_definition->detection_rule[product_definition->num_detection_rules + -1] =
             detection_rule;
        product_definition_local._4_4_ = 0;
      }
    }
    else {
      product_definition_local._4_4_ = -1;
    }
  }
  return product_definition_local._4_4_;
}

Assistant:

int coda_product_definition_add_detection_rule(coda_product_definition *product_definition,
                                               coda_detection_rule *detection_rule)
{
    coda_detection_rule **new_detection_rule;

    if (detection_rule->num_entries == 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "detection rule for '%s' should have at least one entry",
                       product_definition->name);
        return -1;
    }

    detection_rule->product_definition = product_definition;

    if (data_dictionary_add_detection_rule(detection_rule) != 0)
    {
        return -1;
    }

    new_detection_rule = realloc(product_definition->detection_rule,
                                 (product_definition->num_detection_rules + 1) * sizeof(coda_detection_rule *));
    if (new_detection_rule == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (product_definition->num_detection_rules + 1) * sizeof(coda_detection_rule *), __FILE__,
                       __LINE__);
        return -1;
    }
    product_definition->detection_rule = new_detection_rule;
    product_definition->num_detection_rules++;
    product_definition->detection_rule[product_definition->num_detection_rules - 1] = detection_rule;

    return 0;
}